

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void leaveblock(FuncState *fs)

{
  int *piVar1;
  byte bVar2;
  LexState *ls;
  BlockCnt *pBVar3;
  Vardesc *pVVar4;
  LocVar *pLVar5;
  BlockCnt *pBVar6;
  Labeldesc *pLVar7;
  TString *name;
  byte bVar8;
  uint uVar9;
  Dyndata *pDVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  
  ls = fs->ls;
  pBVar3 = fs->bl;
  bVar2 = pBVar3->nactvar;
  uVar9 = (uint)bVar2;
  do {
    if ((int)uVar9 < 1) {
      pDVar10 = ls->dyd;
      iVar11 = 0;
      goto LAB_0014a4f4;
    }
    uVar9 = uVar9 - 1;
    pDVar10 = ls->dyd;
    pVVar4 = (pDVar10->actvar).arr;
    lVar13 = (long)(int)(fs->firstlocal + uVar9);
  } while (*(char *)((long)pVVar4 + lVar13 * 0x18 + 9) == '\x03');
  iVar11 = (&pVVar4->vd)[lVar13].ridx + 1;
LAB_0014a4f4:
  bVar8 = fs->nactvar;
  piVar1 = &(pDVar10->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar2 - (uint)bVar8);
  if (bVar2 < bVar8) {
    pVVar4 = (pDVar10->actvar).arr;
    iVar12 = (bVar8 - 1 & 0xff) + fs->firstlocal;
    do {
      bVar8 = bVar8 - 1;
      fs->nactvar = bVar8;
      if ((*(char *)((long)pVVar4 + (long)iVar12 * 0x18 + 9) != '\x03') &&
         (pLVar5 = fs->f->locvars, pLVar5 != (LocVar *)0x0)) {
        pLVar5[(&pVVar4->vd)[iVar12].pidx].endpc = fs->pc;
      }
      iVar12 = iVar12 + -1;
    } while (bVar2 < bVar8);
  }
  if (pBVar3->isloop != '\0') {
    name = luaS_newlstr(ls->L,"break",5);
    iVar12 = createlabel(ls,name,0,0);
    if (iVar12 != 0) goto LAB_0014a59e;
  }
  if ((pBVar3->previous != (BlockCnt *)0x0) && (pBVar3->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,iVar11,0,0,0);
  }
LAB_0014a59e:
  fs->freereg = (lu_byte)iVar11;
  pDVar10 = ls->dyd;
  (pDVar10->label).n = pBVar3->firstlabel;
  pBVar6 = pBVar3->previous;
  fs->bl = pBVar6;
  if (pBVar6 == (BlockCnt *)0x0) {
    if (pBVar3->firstgoto < (pDVar10->gt).n) {
      undefgoto(ls,(pDVar10->gt).arr + pBVar3->firstgoto);
    }
  }
  else {
    pDVar10 = fs->ls->dyd;
    lVar13 = (long)pBVar3->firstgoto;
    iVar11 = (pDVar10->gt).n;
    if (pBVar3->firstgoto < iVar11) {
      pLVar7 = (pDVar10->gt).arr;
      bVar2 = pBVar3->nactvar;
      do {
        uVar9 = (uint)pLVar7[lVar13].nactvar;
        do {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
            goto LAB_0014a61f;
          }
          uVar9 = uVar9 - 1;
          pVVar4 = (pDVar10->actvar).arr;
          lVar15 = (long)(int)(fs->firstlocal + uVar9);
        } while (*(char *)((long)pVVar4 + lVar15 * 0x18 + 9) == '\x03');
        uVar9 = (&pVVar4->vd)[lVar15].ridx + 1;
LAB_0014a61f:
        uVar14 = (uint)bVar2;
        do {
          if ((int)uVar14 < 1) {
            uVar14 = 0;
            goto LAB_0014a653;
          }
          uVar14 = uVar14 - 1;
          pVVar4 = (pDVar10->actvar).arr;
          lVar15 = (long)(int)(fs->firstlocal + uVar14);
        } while (*(char *)((long)pVVar4 + lVar15 * 0x18 + 9) == '\x03');
        uVar14 = (&pVVar4->vd)[lVar15].ridx + 1;
LAB_0014a653:
        if (uVar14 < uVar9) {
          pLVar7[lVar13].close = pLVar7[lVar13].close | pBVar3->upval;
        }
        pLVar7[lVar13].nactvar = bVar2;
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar11);
    }
  }
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  int hasclose = 0;
  int stklevel = reglevel(fs, bl->nactvar);  /* level outside the block */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop)  /* has to fix pending breaks? */
    hasclose = createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  if (!hasclose && bl->previous && bl->upval)  /* still need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
  fs->bl = bl->previous;  /* current block now is previous one */
  if (bl->previous)  /* was it a nested block? */
    movegotosout(fs, bl);  /* update pending gotos to enclosing block */
  else {
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
}